

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O2

void __thiscall o3dgc::Vector<char>::PushBack(Vector<char> *this,char *value)

{
  char cVar1;
  char *__src;
  char *__dest;
  size_t sVar2;
  size_t __n;
  
  sVar2 = this->m_allocated;
  __n = this->m_size;
  if (__n == sVar2) {
    sVar2 = 0x20;
    if (0x20 < __n * 2) {
      sVar2 = __n * 2;
    }
    this->m_allocated = sVar2;
    __dest = (char *)operator_new__(sVar2);
    if (__n == 0) {
      __n = 0;
    }
    else {
      __src = this->m_buffer;
      memcpy(__dest,__src,__n);
      if (__src != (char *)0x0) {
        operator_delete__(__src);
        sVar2 = this->m_allocated;
        __n = this->m_size;
      }
    }
    this->m_buffer = __dest;
  }
  if (__n < sVar2) {
    cVar1 = *value;
    this->m_size = __n + 1;
    this->m_buffer[__n] = cVar1;
    return;
  }
  __assert_fail("m_size < m_allocated",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/Open3DGC/o3dgcVector.h"
                ,0x58,"void o3dgc::Vector<char>::PushBack(const T &) [T = char]");
}

Assistant:

void                    PushBack(const T & value)
                                {
                                    if (m_size == m_allocated)
                                    {
                                        m_allocated *= 2;
                                        if (m_allocated < O3DGC_DEFAULT_VECTOR_SIZE)
                                        {
                                            m_allocated = O3DGC_DEFAULT_VECTOR_SIZE;
                                        }
                                        T * tmp      = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                    assert(m_size < m_allocated);
                                    m_buffer[m_size++] = value;
                                }